

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btype.h
# Opt level: O0

Btype __thiscall verona::operator/(verona *this,Btype *b,Token *f)

{
  element_type *t;
  element_type *node;
  Node *pNVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Btype BVar2;
  WFLookup local_50;
  shared_ptr<trieste::NodeDef> local_30;
  Token *local_20;
  Token *f_local;
  Btype *b_local;
  
  local_20 = f;
  f_local = (Token *)b;
  b_local = (Btype *)this;
  t = ::std::__shared_ptr_access<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 b);
  node = ::std::__shared_ptr_access<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)f_local);
  trieste::operator/(&local_50,&node->node,local_20);
  pNVar1 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_50);
  ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_30,pNVar1);
  BtypeDef::make((BtypeDef *)this,&t->node);
  ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_30);
  trieste::wf::detail::WFLookup::~WFLookup(&local_50);
  BVar2.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  BVar2.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Btype)BVar2.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Btype operator/(Btype& b, const Token& f)
  {
    return b->make(b->node / f);
  }